

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

content_encoding * find_encoding(char *name,size_t len)

{
  content_encoding *pcVar1;
  int iVar2;
  content_encoding *ce;
  content_encoding **cep;
  size_t len_local;
  char *name_local;
  
  ce = (content_encoding *)encodings;
  while( true ) {
    if (ce->name == (char *)0x0) {
      return (content_encoding *)0x0;
    }
    pcVar1 = (content_encoding *)ce->name;
    iVar2 = Curl_strncasecompare(name,pcVar1->name,len);
    if ((iVar2 != 0) && (pcVar1->name[len] == '\0')) break;
    if (((pcVar1->alias != (char *)0x0) &&
        (iVar2 = Curl_strncasecompare(name,pcVar1->alias,len), iVar2 != 0)) &&
       (pcVar1->alias[len] == '\0')) {
      return pcVar1;
    }
    ce = (content_encoding *)&ce->alias;
  }
  return pcVar1;
}

Assistant:

static const struct content_encoding *find_encoding(const char *name,
                                                    size_t len)
{
  const struct content_encoding * const *cep;

  for(cep = encodings; *cep; cep++) {
    const struct content_encoding *ce = *cep;
    if((strncasecompare(name, ce->name, len) && !ce->name[len]) ||
       (ce->alias && strncasecompare(name, ce->alias, len) && !ce->alias[len]))
      return ce;
  }
  return NULL;
}